

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialog::setComboBoxEditable(QInputDialog *this,bool editable)

{
  byte bVar1;
  InputMode IVar2;
  byte in_SIL;
  undefined1 unaff_retaddr;
  QComboBox *in_stack_00000008;
  QInputDialogPrivate *d;
  QInputDialogPrivate *in_stack_00000028;
  QInputDialog *in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  d_func((QInputDialog *)0x79c775);
  QInputDialogPrivate::ensureComboBox(in_stack_00000028);
  QComboBox::setEditable(in_stack_00000008,(bool)unaff_retaddr);
  IVar2 = inputMode(in_stack_ffffffffffffffd8);
  if (IVar2 == TextInput) {
    QInputDialogPrivate::chooseRightTextInputWidget
              ((QInputDialogPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void QInputDialog::setComboBoxEditable(bool editable)
{
    Q_D(QInputDialog);
    d->ensureComboBox();
    d->comboBox->setEditable(editable);
    if (inputMode() == TextInput)
        d->chooseRightTextInputWidget();
}